

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O0

void __thiscall QDoubleSpinBox::setRange(QDoubleSpinBox *this,double minimum,double maximum)

{
  QDoubleSpinBoxPrivate *this_00;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  double dVar1;
  double in_XMM1_Qa;
  QDoubleSpinBoxPrivate *d;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QDoubleSpinBox *)0x6927b7);
  this_00->actualMin = in_XMM0_Qa;
  this_00->actualMax = in_XMM1_Qa;
  dVar1 = QDoubleSpinBoxPrivate::round(this_00,in_XMM0_Qa);
  ::QVariant::QVariant(&local_28,dVar1);
  dVar1 = QDoubleSpinBoxPrivate::round(this_00,in_XMM1_Qa);
  ::QVariant::QVariant(&local_48,dVar1);
  (**(code **)(*(long *)&(this_00->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xb0))
            (this_00,&local_28,&local_48);
  ::QVariant::~QVariant(&local_48);
  ::QVariant::~QVariant(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDoubleSpinBox::setRange(double minimum, double maximum)
{
    Q_D(QDoubleSpinBox);
    d->actualMin = minimum;
    d->actualMax = maximum;
    d->setRange(QVariant(d->round(minimum)), QVariant(d->round(maximum)));
}